

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O1

void __thiscall rst::Parser::ParseBlock(Parser *this,BlockType type,BlockType *prev_type,int indent)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  byte *pbVar8;
  char *s;
  byte *pbVar9;
  bool bVar10;
  string text;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  int local_44;
  BlockType *local_40;
  long local_38;
  
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  local_38 = (long)indent;
  bVar10 = true;
  local_44 = indent;
  local_40 = prev_type;
  do {
    if (!bVar10) {
      pbVar9 = (byte *)this->ptr_;
      pbVar8 = pbVar9;
      while( true ) {
        if ((0x20 < (ulong)*pbVar8) || ((0x100001a00U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)) break;
        this->ptr_ = (char *)(pbVar8 + 1);
        pbVar8 = pbVar8 + 1;
      }
      pcVar2 = this->ptr_;
      if (((long)pcVar2 - (long)pbVar9 != local_38) || (*pcVar2 == '\0')) goto LAB_00216723;
      if (*pcVar2 == '\n') {
        this->ptr_ = pcVar2 + 1;
LAB_00216723:
        if (local_68[local_60 - 1] == '\n') {
          std::__cxx11::string::resize((ulong)&local_68,(char)local_60 + -1);
        }
        if ((type == PARAGRAPH) && (1 < local_60)) {
          iVar4 = strcmp(local_68 + (local_60 - 2),"::");
          bVar10 = iVar4 == 0;
        }
        else {
          bVar10 = false;
        }
        uVar3 = local_60;
        if ((bVar10 == false) || (local_60 != 2)) {
          EnterBlock(this,local_40,type);
          (*this->handler_->_vptr_ContentHandler[2])(this->handler_,(ulong)type);
          (*this->handler_->_vptr_ContentHandler[4])(this->handler_,local_68,uVar3 - bVar10);
          (*this->handler_->_vptr_ContentHandler[3])();
        }
        if (bVar10 != false) {
          pbVar9 = (byte *)this->ptr_;
          pbVar8 = pbVar9;
          while( true ) {
            if ((0x20 < (ulong)*pbVar8) || ((0x100001a00U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))
            break;
            this->ptr_ = (char *)(pbVar8 + 1);
            pbVar8 = pbVar8 + 1;
          }
          iVar4 = *(int *)&this->ptr_ - (int)pbVar9;
          if (local_44 < iVar4) {
            ParseBlock(this,LITERAL_BLOCK,local_40,iVar4);
          }
        }
        if (local_68 != &local_58) {
          operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
        }
        return;
      }
    }
    pbVar9 = (byte *)this->ptr_;
    lVar5 = 0;
    lVar6 = 0;
    pbVar8 = pbVar9;
    while ((*pbVar8 != 0 && (*pbVar8 != 10))) {
      pbVar8 = pbVar8 + 1;
      this->ptr_ = (char *)pbVar8;
      lVar6 = lVar6 + -1;
      lVar5 = lVar5 + 1;
    }
    while (lVar6 != 0) {
      if ((0x20 < (ulong)pbVar9[lVar5 + -1]) ||
         ((0x100001a00U >> ((ulong)pbVar9[lVar5 + -1] & 0x3f) & 1) == 0)) {
        pbVar8 = pbVar9 + lVar5;
        break;
      }
      lVar5 = lVar5 + -1;
      pbVar8 = pbVar9;
      lVar6 = lVar5;
    }
    std::__cxx11::string::reserve((ulong)&local_68);
    cVar7 = (char)&local_68;
    if (!bVar10) {
      std::__cxx11::string::push_back(cVar7);
    }
    for (; pbVar9 != pbVar8; pbVar9 = pbVar9 + 1) {
      bVar1 = *pbVar9;
      if (((bVar1 - 0xb < 2) || (bVar1 == 0x20)) || (bVar1 != 9)) {
        std::__cxx11::string::push_back(cVar7);
      }
      else {
        std::__cxx11::string::append((char *)&local_68,0x228f2c);
      }
    }
    bVar10 = false;
    if (*this->ptr_ == '\n') {
      this->ptr_ = this->ptr_ + 1;
      bVar10 = false;
    }
  } while( true );
}

Assistant:

void rst::Parser::ParseBlock(
    rst::BlockType type, rst::BlockType &prev_type, int indent) {
  std::string text;
  for (bool first = true; ; first = false) {
    const char *line_start = ptr_;
    if (!first) {
      // Check indentation.
      SkipSpace();
      if (ptr_ - line_start != indent)
        break;
      if (*ptr_ == '\n') {
        ++ptr_;
        break;  // Empty line ends the block.
      }
      if (!*ptr_)
        break;  // End of input.
    }
    // Strip indentation.
    line_start = ptr_;

    // Find the end of the line.
    while (*ptr_ && *ptr_ != '\n')
      ++ptr_;

    // Strip whitespace at the end of the line.
    const char *end = ptr_;
    while (end != line_start && IsSpace(end[-1]))
      --end;

    // Copy text converting all whitespace characters to spaces.
    text.reserve(end - line_start + 1);
    if (!first)
      text.push_back('\n');
    enum {TAB_WIDTH = 8};
    for (const char *s = line_start; s != end; ++s) {
      char c = *s;
      if (c == '\t') {
        text.append("        ",
            TAB_WIDTH - ((indent + s - line_start) % TAB_WIDTH));
      } else if (IsSpace(c)) {
        text.push_back(' ');
      } else {
        text.push_back(*s);
      }
    }
    if (*ptr_ == '\n')
      ++ptr_;
  }

  // Remove a trailing newline.
  if (*text.rbegin() == '\n')
    text.resize(text.size() - 1);

  bool literal = type == PARAGRAPH && EndsWith(text, "::");
  if (!literal || text.size() != 2) {
    std::size_t size = text.size();
    if (literal)
      --size;
    EnterBlock(prev_type, type);
    handler_->StartBlock(type);
    handler_->HandleText(text.c_str(), size);
    handler_->EndBlock();
  }
  if (literal) {
    // Parse a literal block.
    const char *line_start = ptr_;
    SkipSpace();
    int new_indent = static_cast<int>(ptr_ - line_start);
    if (new_indent > indent)
      ParseBlock(LITERAL_BLOCK, prev_type, new_indent);
  }
}